

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  options __x;
  bool bVar1;
  reference pbVar2;
  char *pcVar3;
  runtime_error *this;
  Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  TVar4;
  undefined1 local_379;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  ulong local_2c8;
  undefined8 uStack_2c0;
  seed_t local_2b8;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  undefined1 local_271;
  char local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  runtime_error local_230 [16];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  string local_170 [36];
  undefined4 local_14c;
  Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  string local_138 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  string local_d8 [8];
  text arg;
  string local_b8 [8];
  text val;
  string local_98 [8];
  text opt;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  iterator pos;
  undefined1 local_48 [7];
  bool in_options;
  texts in;
  undefined1 uStack_28;
  undefined1 uStack_27;
  byte bStack_26;
  undefined1 uStack_25;
  options option;
  texts *args_local;
  
  options::options((options *)
                   ((long)&in.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  pos._M_current._7_1_ = 1;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(args);
  local_58._M_current = local_60;
  do {
    local_78[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
    bVar1 = __gnu_cxx::operator!=(&local_58,local_78);
    if (!bVar1) {
      local_379 = 1;
      if ((bStack_26 & 1) == 0) {
        local_379 = uStack_25;
      }
      local_2b8._0_1_ = option.lexical;
      local_2b8._1_1_ = option.random;
      local_2b8._2_1_ = option.verbose;
      local_2b8._3_1_ = option.version;
      local_2c8 = CONCAT17(uStack_25,
                           CONCAT16(local_379,
                                    CONCAT15(uStack_27,
                                             CONCAT14(uStack_28,
                                                      CONCAT13(in.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._7_1_,CONCAT12(in.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._6_1_,CONCAT11(in.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,in.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_))))))) & 0xff01ffffffffffff;
      uStack_2c0 = CONCAT44(option._4_4_,
                            CONCAT13(option.list,
                                     CONCAT12(option.count,CONCAT11(option.abort,option.help))));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48);
      __x.lexical = (bool)(undefined1)uStack_2c0;
      __x.random = (bool)uStack_2c0._1_1_;
      __x.verbose = (bool)uStack_2c0._2_1_;
      __x.version = (bool)uStack_2c0._3_1_;
      __x.repeat = uStack_2c0._4_4_;
      __x.help = (bool)(undefined1)local_2c8;
      __x.abort = (bool)local_2c8._1_1_;
      __x.count = (bool)local_2c8._2_1_;
      __x.list = (bool)local_2c8._3_1_;
      __x.tags = (bool)local_2c8._4_1_;
      __x.time = (bool)local_2c8._5_1_;
      __x.pass = (bool)local_2c8._6_1_;
      __x.zen = (bool)local_2c8._7_1_;
      __x.seed = local_2b8;
      std::
      make_pair<lest::options,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_2a8,__x,&local_2e0);
      std::
      pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pair(__return_storage_ptr__,&local_2a8);
      std::
      pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair(&local_2a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2e0);
      local_14c = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string(local_98);
    std::__cxx11::string::string(local_b8);
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_58);
    std::__cxx11::string::string(local_d8,(string *)pbVar2);
    std::__cxx11::string::string(local_138,local_d8);
    split_option(&local_118,(text *)local_138);
    TVar4 = tie<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b8);
    local_148 = TVar4;
    Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_148,&local_118);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_118);
    std::__cxx11::string::~string(local_138);
    if ((pos._M_current._7_1_ & 1) == 0) {
LAB_00106667:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,(value_type *)local_d8);
      local_14c = 0;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
      if (*pcVar3 != '-') {
        pos._M_current._7_1_ = 0;
        goto LAB_00106667;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"--");
      if (bVar1) {
        pos._M_current._7_1_ = 0;
        local_14c = 4;
        goto LAB_00106683;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"-h");
      if (bVar1) {
LAB_00105e12:
        in.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
        local_14c = 4;
      }
      else {
        bVar1 = std::operator==("--help",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_98);
        if (bVar1) goto LAB_00105e12;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"-a");
        if (bVar1) {
LAB_00105e73:
          in.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
          local_14c = 4;
        }
        else {
          bVar1 = std::operator==("--abort",
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98);
          if (bVar1) goto LAB_00105e73;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98,"-c");
          if (bVar1) {
LAB_00105ed4:
            in.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
            local_14c = 4;
          }
          else {
            bVar1 = std::operator==("--count",
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98);
            if (bVar1) goto LAB_00105ed4;
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98,"-g");
            if (bVar1) {
LAB_00105f35:
              uStack_28 = 1;
              local_14c = 4;
            }
            else {
              bVar1 = std::operator==("--list-tags",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_98);
              if (bVar1) goto LAB_00105f35;
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_98,"-l");
              if (bVar1) {
LAB_00105f96:
                in.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                local_14c = 4;
              }
              else {
                bVar1 = std::operator==("--list-tests",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_98);
                if (bVar1) goto LAB_00105f96;
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_98,"-t");
                if (bVar1) {
LAB_00105ff7:
                  uStack_27 = 1;
                  local_14c = 4;
                }
                else {
                  bVar1 = std::operator==("--time",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                  if (bVar1) goto LAB_00105ff7;
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_98,"-p");
                  if (bVar1) {
LAB_00106058:
                    bStack_26 = 1;
                    local_14c = 4;
                  }
                  else {
                    bVar1 = std::operator==("--pass",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98);
                    if (bVar1) goto LAB_00106058;
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_98,"-z");
                    if (bVar1) {
LAB_001060b9:
                      uStack_25 = 1;
                      local_14c = 4;
                    }
                    else {
                      bVar1 = std::operator==("--pass-zen",
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_98);
                      if (bVar1) goto LAB_001060b9;
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_98,"-v");
                      if (bVar1) {
LAB_0010611a:
                        option.count = true;
                        local_14c = 4;
                      }
                      else {
                        bVar1 = std::operator==("--verbose",
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_98);
                        if (bVar1) goto LAB_0010611a;
                        bVar1 = std::operator==("--version",
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_98);
                        if (bVar1) {
                          option.list = true;
                          local_14c = 4;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98,"--order");
                          if (bVar1) {
                            bVar1 = std::operator==("declared",
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8);
                            if (bVar1) {
                              local_14c = 4;
                              goto LAB_00106683;
                            }
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98,"--order");
                          if (bVar1) {
                            bVar1 = std::operator==("lexical",
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8);
                            if (bVar1) {
                              option.help = true;
                              local_14c = 4;
                              goto LAB_00106683;
                            }
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98,"--order");
                          if (bVar1) {
                            bVar1 = std::operator==("random",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8);
                            if (bVar1) {
                              option.abort = true;
                              local_14c = 4;
                              goto LAB_00106683;
                            }
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98,"--random-seed");
                          if (bVar1) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_190,"--random-seed",&local_191);
                            std::__cxx11::string::string(local_170,local_190);
                            std::__cxx11::string::string(local_1b8,local_b8);
                            option._8_4_ = seed((text *)local_170,(text *)local_1b8);
                            std::__cxx11::string::~string(local_1b8);
                            std::__cxx11::string::~string(local_170);
                            std::__cxx11::string::~string(local_190);
                            std::allocator<char>::~allocator((allocator<char> *)&local_191);
                            local_14c = 4;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_98,"--repeat");
                            if (!bVar1) {
                              local_271 = 1;
                              this = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::operator+(local_270,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)"unrecognised option \'");
                              std::operator+(local_250,local_270);
                              std::runtime_error::runtime_error(local_230,(string *)local_250);
                              std::runtime_error::runtime_error(this,local_230);
                              local_271 = 0;
                              __cxa_throw(this,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_1f8,"--repeat",&local_1f9);
                            std::__cxx11::string::string(local_1d8,local_1f8);
                            std::__cxx11::string::string(local_220,local_b8);
                            option._4_4_ = repeat((text *)local_1d8,(text *)local_220);
                            std::__cxx11::string::~string(local_220);
                            std::__cxx11::string::~string(local_1d8);
                            std::__cxx11::string::~string(local_1f8);
                            std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
                            local_14c = 4;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00106683:
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_98);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}